

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::DrawElementsBaseVertexTests::init
          (DrawElementsBaseVertexTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int iVar1;
  MethodGroup *this_00;
  char *name_00;
  char *descr;
  DrawMethod method;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined1 local_60 [8];
  string desc;
  string name;
  int ndx;
  DrawMethod basicMethods [3];
  DrawElementsBaseVertexTests *this_local;
  
  stack0xffffffffffffffe4 = 0x900000007;
  iVar1 = 8;
  name.field_2._8_4_ = 0;
  while ((int)name.field_2._8_4_ < 3) {
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)
               (ulong)*(uint *)((long)&name.field_2 + (long)(int)name.field_2._8_4_ * 4 + 0xc),
               (DrawMethod)in_RDX);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)local_60,
               (DrawTestSpec *)
               (ulong)*(uint *)((long)&name.field_2 + (long)(int)name.field_2._8_4_ * 4 + 0xc),
               method);
    this_00 = (MethodGroup *)operator_new(0x80);
    context = (this->super_TestCaseGroup).m_context;
    name_00 = (char *)std::__cxx11::string::c_str();
    descr = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::MethodGroup::MethodGroup
              (this_00,context,name_00,descr,
               *(DrawMethod *)((long)&name.field_2 + (long)(int)name.field_2._8_4_ * 4 + 0xc));
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    iVar1 = name.field_2._8_4_ + 1;
    in_RDX = extraout_RDX;
    name.field_2._8_4_ = iVar1;
  }
  return iVar1;
}

Assistant:

void DrawElementsBaseVertexTests::init (void)
{
	const gls::DrawTestSpec::DrawMethod basicMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX,
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
	{
		const std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
		const std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

		this->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
	}
}